

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinystr.cpp
# Opt level: O0

TiXmlString operator+(TiXmlString *a,char *b)

{
  size_t len;
  size_type sVar1;
  char *in_RDX;
  size_type b_len;
  char *b_local;
  TiXmlString *a_local;
  TiXmlString *tmp;
  
  TiXmlString::TiXmlString(a);
  len = strlen(in_RDX);
  sVar1 = TiXmlString::length((TiXmlString *)b);
  TiXmlString::reserve(a,sVar1 + len);
  TiXmlString::operator+=(a,(TiXmlString *)b);
  TiXmlString::append(a,in_RDX,len);
  return (TiXmlString)(Rep *)a;
}

Assistant:

TiXmlString operator + (const TiXmlString & a, const char* b)
{
	TiXmlString tmp;
	TiXmlString::size_type b_len = static_cast<TiXmlString::size_type>( strlen(b) );
	tmp.reserve(a.length() + b_len);
	tmp += a;
	tmp.append(b, b_len);
	return tmp;
}